

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uset.cpp
# Opt level: O2

UBool uset_containsAllCodePoints_63(USet *set,UChar *str,int32_t strLen)

{
  UBool UVar1;
  UnicodeString s;
  ConstChar16Ptr local_60;
  UChar *local_58;
  UnicodeString local_48;
  
  local_60.p_ = str;
  icu_63::UnicodeString::UnicodeString(&local_48,strLen == -1,&local_60,strLen);
  local_58 = local_60.p_;
  UVar1 = icu_63::UnicodeSet::containsAll((UnicodeSet *)set,&local_48);
  icu_63::UnicodeString::~UnicodeString(&local_48);
  return UVar1;
}

Assistant:

U_CAPI UBool U_EXPORT2
uset_containsAllCodePoints(const USet* set, const UChar *str, int32_t strLen) {
    // Create a string alias, since nothing is being added to the set.
    UnicodeString s(strLen==-1, str, strLen);
    return ((const UnicodeSet*) set)->UnicodeSet::containsAll(s);
}